

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Namespace *n)

{
  pointer ppVar1;
  VariableDeclaration *pVVar2;
  bool bVar3;
  pool_ref<soul::AST::Function> *extraout_RDX;
  pointer ppVar4;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions;
  CompileMessage CStack_48;
  
  ASTVisitor::visit(&this->super_ASTVisitor,n);
  functions.e = extraout_RDX;
  functions.s = (n->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  checkForDuplicateFunctions
            ((SanityCheckPass *)
             (n->functions).
             super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             ._M_impl.super__Vector_impl_data._M_start,functions);
  ppVar4 = (n->constants).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (n->constants).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar4 == ppVar1) {
      return;
    }
    bVar3 = AST::VariableDeclaration::isCompileTimeConstant(ppVar4->object);
    if (!bVar3) break;
    ppVar4 = ppVar4 + 1;
  }
  pVVar2 = ppVar4->object;
  Errors::nonConstInNamespace<>();
  AST::Context::throwError(&(pVVar2->super_Statement).super_ASTObject.context,&CStack_48,false);
}

Assistant:

void visit (AST::Namespace& n) override
        {
            super::visit (n);
            checkForDuplicateFunctions (n.functions);

            for (auto& v : n.constants)
                if (! v->isCompileTimeConstant())
                    v->context.throwError (Errors::nonConstInNamespace());
        }